

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTime.c
# Opt level: O2

void If_CutPropagateRequired(If_Man_t *p,If_Obj_t *pObj,If_Cut_t *pCut,float ObjRequired)

{
  If_Par_t *pIVar1;
  If_LibLut_t *pIVar2;
  uint uVar3;
  int iVar4;
  If_Obj_t *pIVar5;
  uint uVar6;
  ulong uVar7;
  int *piVar8;
  float *pPerm;
  float fVar9;
  float fVar10;
  char Perm [15];
  float local_37 [3];
  
  pIVar1 = p->pPars;
  if (pIVar1->fLiftLeaves != 0) {
    __assert_fail("!p->pPars->fLiftLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                  ,0xba,"void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)");
  }
  uVar3 = *(uint *)&pCut->field_0x1c;
  if ((short)uVar3 < 0) {
    for (uVar7 = 0; uVar7 < uVar3 >> 0x18; uVar7 = uVar7 + 1) {
      pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar7]);
      if (pIVar5 == (If_Obj_t *)0x0) {
        return;
      }
      fVar9 = ObjRequired - (float)p->pPars->nAndDelay;
      fVar10 = pIVar5->Required;
      if (fVar9 <= pIVar5->Required) {
        fVar10 = fVar9;
      }
      pIVar5->Required = fVar10;
      uVar3 = *(uint *)&pCut->field_0x1c;
    }
  }
  else {
    pIVar2 = pIVar1->pLutLib;
    if (pIVar2 == (If_LibLut_t *)0x0) {
      if ((uVar3 >> 0xd & 1) == 0) {
        for (uVar7 = 0; uVar7 < uVar3 >> 0x18; uVar7 = uVar7 + 1) {
          pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar7]);
          if (pIVar5 == (If_Obj_t *)0x0) {
            return;
          }
          fVar10 = pIVar5->Required;
          if (ObjRequired + -1.0 <= pIVar5->Required) {
            fVar10 = ObjRequired + -1.0;
          }
          pIVar5->Required = fVar10;
          uVar3 = *(uint *)&pCut->field_0x1c;
        }
      }
      else {
        if (pIVar1->fDelayOpt == 0) {
          if (pIVar1->fDelayOptLut == 0) {
            if (pIVar1->fDsdBalance == 0) {
              pPerm = &pCut[1].Area + (uVar3 >> 0x18);
            }
            else {
              pPerm = local_37;
              iVar4 = If_CutDsdBalancePinDelays(p,pCut,(char *)pPerm);
              if (iVar4 != (int)pCut->Delay) {
                __assert_fail("Delay == (int)pCut->Delay",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                              ,0xe8,
                              "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                             );
              }
            }
          }
          else {
            pPerm = local_37;
            iVar4 = If_CutLutBalancePinDelays(p,pCut,(char *)pPerm);
            if (iVar4 != (int)pCut->Delay) {
              __assert_fail("Delay == (int)pCut->Delay",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                            ,0xe3,
                            "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)"
                           );
            }
          }
        }
        else {
          pPerm = local_37;
          iVar4 = If_CutSopBalancePinDelays(p,pCut,(char *)pPerm);
          if (iVar4 != (int)pCut->Delay) {
            __assert_fail("Delay == (int)pCut->Delay",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifTime.c"
                          ,0xde,
                          "void If_CutPropagateRequired(If_Man_t *, If_Obj_t *, If_Cut_t *, float)")
            ;
          }
        }
        for (uVar7 = 0; uVar7 < (byte)pCut->field_0x1f; uVar7 = uVar7 + 1) {
          pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar7]);
          if (pIVar5 == (If_Obj_t *)0x0) {
            return;
          }
          fVar10 = -120.0;
          if (*(char *)((long)pPerm + uVar7) != 'x') {
            fVar10 = (float)(int)*(char *)((long)pPerm + uVar7);
          }
          fVar9 = pIVar5->Required;
          if (ObjRequired - fVar10 <= pIVar5->Required) {
            fVar9 = ObjRequired - fVar10;
          }
          pIVar5->Required = fVar9;
        }
      }
    }
    else {
      uVar6 = uVar3 >> 0x18;
      if (pIVar2->fVarPinDelays == 0) {
        for (uVar7 = 0; uVar7 < uVar3 >> 0x18; uVar7 = uVar7 + 1) {
          pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[uVar7]);
          if (pIVar5 == (If_Obj_t *)0x0) {
            return;
          }
          fVar9 = ObjRequired - pIVar2->pLutDelays[uVar6][0];
          fVar10 = pIVar5->Required;
          if (fVar9 <= pIVar5->Required) {
            fVar10 = fVar9;
          }
          pIVar5->Required = fVar10;
          uVar3 = *(uint *)&pCut->field_0x1c;
        }
      }
      else {
        piVar8 = If_CutPropagateRequired::pPinPerm;
        If_CutSortInputPins(p,pCut,If_CutPropagateRequired::pPinPerm,
                            If_CutPropagateRequired::pPinDelays);
        for (uVar7 = 0; uVar7 < (byte)pCut->field_0x1f; uVar7 = uVar7 + 1) {
          fVar9 = ObjRequired - pIVar2->pLutDelays[uVar6][uVar7];
          pIVar5 = If_ManObj(p,(int)(&pCut[1].Area)[*piVar8]);
          fVar10 = pIVar5->Required;
          if (fVar9 <= pIVar5->Required) {
            fVar10 = fVar9;
          }
          pIVar5->Required = fVar10;
          piVar8 = piVar8 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void If_CutPropagateRequired( If_Man_t * p, If_Obj_t * pObj, If_Cut_t * pCut, float ObjRequired )
{
    static int pPinPerm[IF_MAX_LUTSIZE];
    static float pPinDelays[IF_MAX_LUTSIZE];
    If_Obj_t * pLeaf;
    float * pLutDelays;
    float Required;
    int i, Pin2PinDelay;//, iLeaf;
    assert( !p->pPars->fLiftLeaves );
    // compute the pins
    if ( pCut->fAndCut )
    {
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            pLeaf->Required = IF_MIN( pLeaf->Required, ObjRequired - p->pPars->nAndDelay );
    }
    else if ( p->pPars->pLutLib )
    {
        pLutDelays = p->pPars->pLutLib->pLutDelays[pCut->nLeaves];
        if ( p->pPars->pLutLib->fVarPinDelays )
        {
            // compute the delay using sorted pins
            If_CutSortInputPins( p, pCut, pPinPerm, pPinDelays );
            for ( i = 0; i < (int)pCut->nLeaves; i++ )
            {
                Required = ObjRequired - pLutDelays[i];
                pLeaf = If_ManObj( p, pCut->pLeaves[pPinPerm[i]] );
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - pLutDelays[0] );
        }
    }
    else
    {
        if ( pCut->fUser )
        {
            char Perm[IF_MAX_FUNC_LUTSIZE], * pPerm = Perm;
            if ( p->pPars->fDelayOpt )
            {
                int Delay = If_CutSopBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDelayOptLut )
            {
                int Delay = If_CutLutBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else if ( p->pPars->fDsdBalance )
            {
                int Delay = If_CutDsdBalancePinDelays( p, pCut, pPerm );
                assert( Delay == (int)pCut->Delay );
            }
            else
                pPerm = If_CutPerm(pCut);
            If_CutForEachLeaf( p, pCut, pLeaf, i )
            {
                Pin2PinDelay = pPerm ? (pPerm[i] == IF_BIG_CHAR ? -IF_BIG_CHAR : pPerm[i]) : 1;
                Required = ObjRequired - (float)Pin2PinDelay;
                pLeaf->Required = IF_MIN( pLeaf->Required, Required );
            }
        }
        else
        {
            Required = ObjRequired;
            If_CutForEachLeaf( p, pCut, pLeaf, i )
                pLeaf->Required = IF_MIN( pLeaf->Required, Required - (float)1.0 );
        }
    }
}